

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *
wasm::WATParser::anon_unknown_0::integer
          (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *__return_storage_ptr__,
          string_view in)

{
  bool bVar1;
  size_t sVar2;
  undefined8 uVar3;
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *poVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  OverflowBehavior in_R8D;
  ulong uVar8;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view in_00;
  string_view in_01;
  LexCtx local_88;
  undefined5 uStack_70;
  undefined3 uStack_6b;
  int iStack_68;
  undefined1 uStack_64;
  undefined1 local_60 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed;
  
  pcVar5 = in._M_str;
  uVar7 = in._M_len;
  local_88.lexedSize = 0;
  uStack_70 = 0;
  uStack_6b = 0;
  iStack_68 = 0;
  uStack_64 = 0;
  uVar8 = 1;
  sv._M_str = "+";
  sv._M_len = 1;
  local_88.input._M_len = uVar7;
  local_88.input._M_str = pcVar5;
  lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
  _32_8_ = __return_storage_ptr__;
  sVar2 = LexCtx::startsWith(&local_88,sv);
  iVar6 = 1;
  if (sVar2 == 0) {
    sv_00._M_str = "-";
    sv_00._M_len = 1;
    sVar2 = LexCtx::startsWith(&local_88,sv_00);
    iVar6 = 2;
    if (sVar2 != 0) goto LAB_00b7c5c1;
    uVar8 = 0;
    iVar6 = 0;
  }
  else {
LAB_00b7c5c1:
    local_88.lexedSize = 1;
  }
  sv_01._M_str = "0x";
  sv_01._M_len = 2;
  iStack_68 = iVar6;
  sVar2 = LexCtx::startsWith(&local_88,sv_01);
  if (sVar2 == 0) {
    if (uVar7 < uVar8) goto LAB_00b7c6a7;
    in_01._M_str = (char *)0x0;
    in_01._M_len = (size_t)(pcVar5 + uVar8);
    num((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_60,
        (anon_unknown_0 *)(uVar7 - uVar8),in_01,in_R8D);
  }
  else {
    uVar8 = uVar8 | 2;
    if (uVar7 < uVar8) {
LAB_00b7c6a7:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar8,uVar7);
    }
    in_00._M_str = (char *)0x0;
    in_00._M_len = (size_t)(pcVar5 + uVar8);
    hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_60,
           (anon_unknown_0 *)(uVar7 - uVar8),in_00,in_R8D);
  }
  if (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign._0_1_ == '\x01') {
    uVar8 = uVar8 + (long)local_60;
    uStack_70 = SUB85(lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_payload._M_value.super_LexResult.span._M_str,0);
    uStack_6b = (undefined3)
                ((ulong)lexed.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                        ._M_payload._8_8_ >> 0x28);
    local_88.lexedSize = uVar8;
    bVar1 = LexCtx::canFinish(&local_88);
    if (bVar1) {
      if (uVar8 == 0) {
        poVar4 = (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)0x0;
      }
      else {
        if (uVar7 < uVar8) {
          uVar8 = uVar7;
        }
        uVar3 = (char *)-(long)lexed.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                               ._M_payload._M_value.super_LexResult.span._M_str;
        if (iVar6 != 2) {
          uVar3 = lexed.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                  ._M_payload._M_value.super_LexResult.span._M_str;
        }
        *(ulong *)lexed.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                  ._32_8_ = uVar8;
        *(char **)(lexed.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                   ._32_8_ + 8) = pcVar5;
        *(undefined8 *)
         (lexed.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
          _M_payload.
          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._32_8_
         + 0x10) = uVar3;
        *(int *)(lexed.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
                 _32_8_ + 0x18) = iVar6;
        poVar4 = (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                 CONCAT71((int7)((ulong)uVar3 >> 8),1);
      }
      *(char *)(lexed.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                ._M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
                _32_8_ + 0x20) = (char)poVar4;
      return poVar4;
    }
  }
  *(undefined1 *)
   (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _32_8_ + 0x20) = 0;
  return (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
         lexed.
         super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
         _M_payload.
         super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._32_8_;
}

Assistant:

std::optional<LexIntResult> integer(std::string_view in) {
  LexIntCtx ctx(in);
  ctx.takeSign();
  if (ctx.takePrefix("0x"sv)) {
    if (auto lexed = hexnum(ctx.next())) {
      ctx.take(*lexed);
      if (ctx.canFinish()) {
        return ctx.lexed();
      }
    }
    // TODO: Add error production for unrecognized hexnum.
    return {};
  }
  if (auto lexed = num(ctx.next())) {
    ctx.take(*lexed);
    if (ctx.canFinish()) {
      return ctx.lexed();
    }
  }
  return {};
}